

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_bgr2rgb(Mat *m,uchar *rgb,int stride)

{
  float *pfVar1;
  int *piVar2;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  int remain;
  int y;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  undefined8 in_stack_fffffffffffffea0;
  int _c;
  Mat *in_stack_fffffffffffffea8;
  Mat *this;
  int local_134 [3];
  int local_128 [3];
  int local_11c [3];
  int local_110;
  int local_10c;
  Mat local_108;
  float *local_c8;
  Mat local_c0;
  float *local_80;
  Mat local_68;
  float *local_28;
  int local_20;
  int local_1c;
  int local_18;
  undefined1 *local_10;
  
  _c = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_18 = *(int *)(in_RDI + 0x2c);
  local_1c = *(int *)(in_RDI + 0x30);
  local_20 = in_EDX + local_18 * -3;
  if (local_20 == 0) {
    local_18 = local_18 * local_1c;
    local_1c = 1;
  }
  local_10 = in_RSI;
  Mat::channel(in_stack_fffffffffffffea8,_c);
  pfVar1 = Mat::operator_cast_to_float_(&local_68);
  Mat::~Mat((Mat *)0x125e2f);
  this = &local_c0;
  local_28 = pfVar1;
  Mat::channel(this,_c);
  pfVar1 = Mat::operator_cast_to_float_(this);
  Mat::~Mat((Mat *)0x125e79);
  local_80 = pfVar1;
  Mat::channel(this,_c);
  pfVar1 = Mat::operator_cast_to_float_(&local_108);
  Mat::~Mat((Mat *)0x125ebb);
  local_c8 = pfVar1;
  for (local_10c = 0; local_10c < local_1c; local_10c = local_10c + 1) {
    for (local_110 = local_18; 0 < local_110; local_110 = local_110 + -1) {
      local_11c[2] = (int)*local_28;
      local_11c[1] = 0;
      piVar2 = std::max<int>(local_11c + 2,local_11c + 1);
      local_11c[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_11c);
      local_10[2] = (char)*piVar2;
      local_128[2] = (int)*local_80;
      local_128[1] = 0;
      piVar2 = std::max<int>(local_128 + 2,local_128 + 1);
      local_128[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_128);
      local_10[1] = (char)*piVar2;
      local_134[2] = (int)*local_c8;
      local_134[1] = 0;
      piVar2 = std::max<int>(local_134 + 2,local_134 + 1);
      local_134[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_134);
      *local_10 = (char)*piVar2;
      local_10 = local_10 + 3;
      local_28 = local_28 + 1;
      local_80 = local_80 + 1;
      local_c8 = local_c8 + 1;
    }
    local_10 = local_10 + local_20;
  }
  return;
}

Assistant:

static void to_bgr2rgb(const Mat& m, unsigned char* rgb, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 3;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);

    for (int y=0; y<h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

        int remain = w;

        for (; remain>0; remain--)
        {
            rgb[2] = SATURATE_CAST_UCHAR(*ptr0);
            rgb[1] = SATURATE_CAST_UCHAR(*ptr1);
            rgb[0] = SATURATE_CAST_UCHAR(*ptr2);

            rgb += 3;
            ptr0++;
            ptr1++;
            ptr2++;
        }

#undef SATURATE_CAST_UCHAR
        rgb += wgap;
    }
}